

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_policy_testing_test.cc
# Opt level: O1

void __thiscall phmap::priv::anon_unknown_0::__Hash_Test::~__Hash_Test(__Hash_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(_, Hash) {
  StatefulTestingHash h1;
  EXPECT_EQ(1, h1.id());
  StatefulTestingHash h2;
  EXPECT_EQ(2, h2.id());
  StatefulTestingHash h1c(h1);
  EXPECT_EQ(1, h1c.id());
  StatefulTestingHash h2m(std::move(h2));
  EXPECT_EQ(2, h2m.id());
  EXPECT_EQ(0, h2.id());
  StatefulTestingHash h3;
  EXPECT_EQ(3, h3.id());
  h3 = StatefulTestingHash();
  EXPECT_EQ(4, h3.id());
  h3 = std::move(h1);
  EXPECT_EQ(1, h3.id());
}